

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInitializers
          (ImmutableMessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *pFVar3;
  ImmutableFieldGenerator *pIVar4;
  int local_1c;
  int i;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    if (iVar2 <= local_1c) break;
    pFVar3 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_1c);
    bVar1 = IsRealOneof(pFVar3);
    if (!bVar1) {
      pFVar3 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_1c);
      pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,pFVar3);
      (*pIVar4->_vptr_ImmutableFieldGenerator[7])(pIVar4,printer);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInitializers(io::Printer* printer) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!IsRealOneof(descriptor_->field(i))) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitializationCode(printer);
    }
  }
}